

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

size_t __thiscall dtc::fdt::property::offset_of_value(property *this,property_value *val)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  property_value *v;
  iterator __end2;
  iterator __begin2;
  vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *__range2;
  size_t off;
  property_value *val_local;
  property *this_local;
  
  __range2 = (vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)0x0;
  __end2 = std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::begin
                     (&this->values);
  v = (property_value *)
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::end
                (&this->values);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
                                *)&v);
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
              ::operator*(&__end2);
    if (this_00 == val) break;
    sVar2 = property_value::size(this_00);
    __range2 = (vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
               ((long)&(__range2->
                       super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>
                       )._M_impl.super__Vector_impl_data._M_start + sVar2);
    __gnu_cxx::
    __normal_iterator<dtc::fdt::property_value_*,_std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>_>
    ::operator++(&__end2);
  }
  return (size_t)__range2;
}

Assistant:

size_t
property::offset_of_value(property_value &val)
{
	size_t off = 0;
	for (auto &v : values)
	{
		if (&v == &val)
		{
			return off;
		}
		off += v.size();
	}
	return -1;
}